

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::decodeRaw(JsonCodec *this,ArrayPtr<const_char> input,Builder output)

{
  bool bVar1;
  Impl *pIVar2;
  Fault local_60;
  Fault f;
  DebugExpression<bool> _kjCondition;
  undefined1 local_40 [8];
  Parser parser;
  JsonCodec *this_local;
  ArrayPtr<const_char> input_local;
  
  parser.nestingDepth = (size_t)this;
  pIVar2 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
  anon_unknown_79::Parser::Parser((Parser *)local_40,pIVar2->maxNestingDepth,input);
  anon_unknown_79::Parser::parseValue((Parser *)local_40,&output);
  f.exception._6_1_ = anon_unknown_79::Parser::inputExhausted((Parser *)local_40);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x36e,FAILED,"parser.inputExhausted()",
               "_kjCondition,\"Input remains after parsing JSON.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [34])"Input remains after parsing JSON.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  return;
}

Assistant:

void JsonCodec::decodeRaw(kj::ArrayPtr<const char> input, JsonValue::Builder output) const {
  Parser parser(impl->maxNestingDepth, input);
  parser.parseValue(output);

  KJ_REQUIRE(parser.inputExhausted(), "Input remains after parsing JSON.");
}